

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_smpl.c
# Opt level: O0

int ossl_ec_GFp_simple_blind_coordinates(EC_GROUP *group,EC_POINT *p,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *range;
  BIGNUM *func;
  BN_CTX *in_RDX;
  long in_RSI;
  long *in_RDI;
  BIGNUM *temp;
  BIGNUM *lambda;
  int ret;
  BN_CTX *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = 0;
  BN_CTX_start(in_RDX);
  range = BN_CTX_get(in_RDX);
  func = BN_CTX_get(in_RDX);
  if (func == (BIGNUM *)0x0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(int)((ulong)range >> 0x20),
                  (char *)func);
    ERR_set_error(0x10,0xc0100,(char *)0x0);
  }
  else {
    do {
      ERR_set_mark();
      iVar2 = BN_priv_rand_range_ex
                        ((BIGNUM *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(BIGNUM *)range,
                         (uint)((ulong)func >> 0x20),in_stack_ffffffffffffffc8);
      ERR_pop_to_mark();
      if (iVar2 == 0) {
        iVar2 = 1;
        goto LAB_0025087f;
      }
      iVar1 = BN_is_zero((BIGNUM *)range);
    } while (iVar1 != 0);
    if ((((*(long *)(*in_RDI + 0x118) == 0) ||
         (iVar1 = (**(code **)(*in_RDI + 0x118))(in_RDI,range,range,in_RDX), iVar1 != 0)) &&
        (iVar1 = (**(code **)(*in_RDI + 0xf8))
                           (in_RDI,*(undefined8 *)(in_RSI + 0x20),*(undefined8 *)(in_RSI + 0x20),
                            range,in_RDX), iVar1 != 0)) &&
       (((iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,func,range,in_RDX), iVar1 != 0 &&
         (iVar1 = (**(code **)(*in_RDI + 0xf8))
                            (in_RDI,*(undefined8 *)(in_RSI + 0x10),*(undefined8 *)(in_RSI + 0x10),
                             func,in_RDX), iVar1 != 0)) &&
        ((iVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,func,func,range,in_RDX), iVar1 != 0 &&
         (iVar1 = (**(code **)(*in_RDI + 0xf8))
                            (in_RDI,*(undefined8 *)(in_RSI + 0x18),*(undefined8 *)(in_RSI + 0x18),
                             func,in_RDX), iVar1 != 0)))))) {
      *(undefined4 *)(in_RSI + 0x28) = 0;
      iVar2 = 1;
    }
  }
LAB_0025087f:
  BN_CTX_end(in_RDX);
  return iVar2;
}

Assistant:

int ossl_ec_GFp_simple_blind_coordinates(const EC_GROUP *group, EC_POINT *p,
                                         BN_CTX *ctx)
{
    int ret = 0;
    BIGNUM *lambda = NULL;
    BIGNUM *temp = NULL;

    BN_CTX_start(ctx);
    lambda = BN_CTX_get(ctx);
    temp = BN_CTX_get(ctx);
    if (temp == NULL) {
        ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    /*-
     * Make sure lambda is not zero.
     * If the RNG fails, we cannot blind but nevertheless want
     * code to continue smoothly and not clobber the error stack.
     */
    do {
        ERR_set_mark();
        ret = BN_priv_rand_range_ex(lambda, group->field, 0, ctx);
        ERR_pop_to_mark();
        if (ret == 0) {
            ret = 1;
            goto end;
        }
    } while (BN_is_zero(lambda));

    /* if field_encode defined convert between representations */
    if ((group->meth->field_encode != NULL
         && !group->meth->field_encode(group, lambda, lambda, ctx))
        || !group->meth->field_mul(group, p->Z, p->Z, lambda, ctx)
        || !group->meth->field_sqr(group, temp, lambda, ctx)
        || !group->meth->field_mul(group, p->X, p->X, temp, ctx)
        || !group->meth->field_mul(group, temp, temp, lambda, ctx)
        || !group->meth->field_mul(group, p->Y, p->Y, temp, ctx))
        goto end;

    p->Z_is_one = 0;
    ret = 1;

 end:
    BN_CTX_end(ctx);
    return ret;
}